

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char cVar1;
  char *pcVar2;
  int patternLength;
  bool bVar3;
  bool bVar4;
  Char *pattern;
  
  skipSpaces(this);
  pcVar2 = this->current_;
  token->start_ = pcVar2;
  if (pcVar2 == this->end_) {
LAB_0067562e:
    token->type_ = tokenEndOfStream;
    goto LAB_00675631;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\"':
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_006756be;
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case '.':
    goto switchD_006755dd_caseD_23;
  case ',':
    token->type_ = tokenArraySeparator;
    break;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this);
    break;
  case '/':
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_006756be:
    bVar3 = true;
    if (bVar4 == false) {
switchD_006755dd_caseD_23:
      token->type_ = tokenError;
      bVar3 = false;
    }
    goto LAB_00675633;
  case ':':
    token->type_ = tokenMemberSeparator;
    break;
  default:
    if (cVar1 == '\0') goto LAB_0067562e;
    if (cVar1 == '[') {
      token->type_ = tokenArrayBegin;
    }
    else {
      if (cVar1 != ']') {
        if (cVar1 == 'f') {
          token->type_ = tokenFalse;
          pattern = "alse";
          patternLength = 4;
        }
        else {
          if (cVar1 == 'n') {
            token->type_ = tokenNull;
            pattern = "ull";
          }
          else {
            if (cVar1 != 't') {
              if (cVar1 == '}') {
                token->type_ = tokenObjectEnd;
              }
              else {
                if (cVar1 != '{') goto switchD_006755dd_caseD_23;
                token->type_ = tokenObjectBegin;
              }
              break;
            }
            token->type_ = tokenTrue;
            pattern = "rue";
          }
          patternLength = 3;
        }
        bVar4 = match(this,pattern,patternLength);
        goto LAB_006756be;
      }
      token->type_ = tokenArrayEnd;
    }
  }
LAB_00675631:
  bVar3 = true;
LAB_00675633:
  token->end_ = this->current_;
  return bVar3;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}